

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendedKalmanFilter.cpp
# Opt level: O0

bool __thiscall
iDynTree::DiscreteExtendedKalmanFilterHelper::ekfSetMeasurementNoiseCovariance
          (DiscreteExtendedKalmanFilterHelper *this,Span<double,__1L> *R)

{
  index_type iVar1;
  pointer peVar2;
  long in_RDI;
  bool bVar3;
  MatrixDynSize local_40 [64];
  
  iVar1 = Span<double,_-1L>::size((Span<double,__1L> *)0x5cf2f2);
  bVar3 = iVar1 == *(long *)(in_RDI + 0x10) * *(long *)(in_RDI + 0x10);
  if (bVar3) {
    peVar2 = Span<double,_-1L>::data((Span<double,__1L> *)0x5cf330);
    iDynTree::MatrixDynSize::MatrixDynSize
              (local_40,peVar2,*(ulong *)(in_RDI + 0x10),*(ulong *)(in_RDI + 0x10));
    iDynTree::MatrixDynSize::operator=((MatrixDynSize *)(in_RDI + 0x1b8),local_40);
    iDynTree::MatrixDynSize::~MatrixDynSize(local_40);
  }
  else {
    iDynTree::reportError
              ("DiscreteExtendedKalmanFilterHelper","setMeasurementNoiseMeanAndCovariance",
               "noise covariance matrix size mismatch");
  }
  return bVar3;
}

Assistant:

bool iDynTree::DiscreteExtendedKalmanFilterHelper::ekfSetMeasurementNoiseCovariance(const iDynTree::Span< double >& R)
{
    if ((size_t)R.size() != m_dim_Y*m_dim_Y)
    {
        iDynTree::reportError("DiscreteExtendedKalmanFilterHelper", "setMeasurementNoiseMeanAndCovariance", "noise covariance matrix size mismatch");
        return false;
    }

    m_R = iDynTree::MatrixDynSize(R.data(), m_dim_Y, m_dim_Y);
    return true;
}